

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<siginfo_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:327:30)>
::getImpl(SimpleTransformPromiseNode<siginfo_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:327:30)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  char *in_R8;
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  *in_R9;
  anon_enum_32 *in_stack_fffffffffffffbd8;
  uint in_stack_fffffffffffffbe0;
  DebugComparison<int,_int_&> _kjCondition;
  ExceptionOr<kj::_::Void> local_3f0;
  ExceptionOr<siginfo_t> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  uVar1 = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr;
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    local_3f0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.file;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1._32_8_;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar1;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3f0.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),0x105);
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0
    ;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         (Detail *)0x0;
    local_3f0.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3f0);
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_001e0690;
    _kjCondition.right = (int *)&depResult.value.ptr.field_1;
    *(this->func).receivedSigurg = true;
    _kjCondition.result = depResult.value.ptr.field_1.value.si_signo == 0x17;
    _kjCondition.left = 0x17;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (Debug::minSeverity < 3 && !_kjCondition.result) {
      in_R8 = "failed: expected (23) == (info.si_signo)";
      in_R9 = (DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
               *)&_kjCondition;
      Debug::log<char_const(&)[41],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x149,ERROR,
                 "\"failed: expected \" \"(23) == (info.si_signo)\", _kjCondition, 23, info.si_signo"
                 ,(char (*) [41])"failed: expected (23) == (info.si_signo)",
                 (DebugComparison<int,_int_&> *)in_R9,(int *)&stack0xfffffffffffffbe4,
                 _kjCondition.right);
    }
    _kjCondition.right = &depResult.value.ptr.field_1.value.si_code;
    _kjCondition.result = depResult.value.ptr.field_1.value.si_code == 0;
    _kjCondition.left = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[45],kj::_::DebugComparison<__11,int&>&,__11,int&>
                ((char *)0x14a,(int)&_kjCondition,(LogSeverity)&stack0xfffffffffffffbe4,
                 (char *)_kjCondition.right,(char (*) [45])in_R8,in_R9,in_stack_fffffffffffffbd8,
                 (int *)(ulong)in_stack_fffffffffffffbe0);
    }
    local_3f0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3f0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3f0);
  }
  if (local_3f0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_001e0690:
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }